

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalDeferredPhrase(Fts3Cursor *pCsr,Fts3Phrase *pPhrase)

{
  int iVar1;
  char *local_90;
  char *aOut_1;
  char *p2_1;
  char *p1_1;
  int nDistance;
  int nMaxUndeferred;
  char *p2;
  char *p1;
  char *aOut;
  int rc;
  int nList;
  char *pList;
  Fts3DeferredToken *pDeferred;
  Fts3PhraseToken *pToken;
  int iPrev;
  int nPoslist;
  char *aPoslist;
  Fts3Phrase *pFStack_20;
  int iToken;
  Fts3Phrase *pPhrase_local;
  Fts3Cursor *pCsr_local;
  
  _iPrev = (char *)0x0;
  pToken._4_4_ = 0;
  pToken._0_4_ = -1;
  aPoslist._4_4_ = 0;
  pFStack_20 = pPhrase;
  pPhrase_local = (Fts3Phrase *)pCsr;
  do {
    if (pFStack_20->nToken <= aPoslist._4_4_) {
      if (-1 < (int)pToken) {
        p1_1._4_4_ = pFStack_20->iDoclistToken;
        if (p1_1._4_4_ < 0) {
          (pFStack_20->doclist).pList = _iPrev;
          (pFStack_20->doclist).nList = pToken._4_4_;
          (pFStack_20->doclist).iDocid = *(sqlite3_int64 *)&(pPhrase_local->doclist).nList;
          (pFStack_20->doclist).bFreeList = 1;
        }
        else {
          if ((int)pToken < p1_1._4_4_) {
            p2_1 = _iPrev;
            aOut_1 = (pFStack_20->doclist).pList;
            p1_1._0_4_ = p1_1._4_4_ - (int)pToken;
          }
          else {
            p2_1 = (pFStack_20->doclist).pList;
            aOut_1 = _iPrev;
            p1_1._0_4_ = (int)pToken - p1_1._4_4_;
          }
          local_90 = (char *)sqlite3_malloc(pToken._4_4_ + 8);
          if (local_90 == (char *)0x0) {
            sqlite3_free(_iPrev);
            return 7;
          }
          (pFStack_20->doclist).pList = local_90;
          iVar1 = fts3PoslistPhraseMerge(&local_90,(int)p1_1,0,1,&p2_1,&aOut_1);
          if (iVar1 == 0) {
            sqlite3_free(local_90);
            (pFStack_20->doclist).pList = (char *)0x0;
            (pFStack_20->doclist).nList = 0;
          }
          else {
            (pFStack_20->doclist).bFreeList = 1;
            (pFStack_20->doclist).nList = (int)local_90 - (int)(pFStack_20->doclist).pList;
          }
          sqlite3_free(_iPrev);
        }
      }
      return 0;
    }
    pDeferred = (Fts3DeferredToken *)(pFStack_20->aToken + aPoslist._4_4_);
    pList = (char *)pDeferred->pList;
    if ((PendingList *)pList != (PendingList *)0x0) {
      aOut._0_4_ = sqlite3Fts3DeferredTokenList
                             ((Fts3DeferredToken *)pList,(char **)&rc,(int *)((long)&aOut + 4));
      if ((int)aOut != 0) {
        return (int)aOut;
      }
      if (_rc == (char *)0x0) {
        sqlite3_free(_iPrev);
        (pFStack_20->doclist).pList = (char *)0x0;
        (pFStack_20->doclist).nList = 0;
        return 0;
      }
      if (_iPrev == (char *)0x0) {
        pToken._4_4_ = aOut._4_4_;
      }
      else {
        p1 = _rc;
        p2 = _iPrev;
        _nDistance = _rc;
        fts3PoslistPhraseMerge(&p1,aPoslist._4_4_ - (int)pToken,0,1,&p2,(char **)&nDistance);
        sqlite3_free(_iPrev);
        _iPrev = _rc;
        pToken._4_4_ = (int)p1 - (int)_rc;
        if (pToken._4_4_ == 0) {
          sqlite3_free(_rc);
          (pFStack_20->doclist).pList = (char *)0x0;
          (pFStack_20->doclist).nList = 0;
          return 0;
        }
      }
      pToken._0_4_ = aPoslist._4_4_;
      _iPrev = _rc;
    }
    aPoslist._4_4_ = aPoslist._4_4_ + 1;
  } while( true );
}

Assistant:

static int fts3EvalDeferredPhrase(Fts3Cursor *pCsr, Fts3Phrase *pPhrase){
  int iToken;                     /* Used to iterate through phrase tokens */
  char *aPoslist = 0;             /* Position list for deferred tokens */
  int nPoslist = 0;               /* Number of bytes in aPoslist */
  int iPrev = -1;                 /* Token number of previous deferred token */

  assert( pPhrase->doclist.bFreeList==0 );

  for(iToken=0; iToken<pPhrase->nToken; iToken++){
    Fts3PhraseToken *pToken = &pPhrase->aToken[iToken];
    Fts3DeferredToken *pDeferred = pToken->pDeferred;

    if( pDeferred ){
      char *pList;
      int nList;
      int rc = sqlite3Fts3DeferredTokenList(pDeferred, &pList, &nList);
      if( rc!=SQLITE_OK ) return rc;

      if( pList==0 ){
        sqlite3_free(aPoslist);
        pPhrase->doclist.pList = 0;
        pPhrase->doclist.nList = 0;
        return SQLITE_OK;

      }else if( aPoslist==0 ){
        aPoslist = pList;
        nPoslist = nList;

      }else{
        char *aOut = pList;
        char *p1 = aPoslist;
        char *p2 = aOut;

        assert( iPrev>=0 );
        fts3PoslistPhraseMerge(&aOut, iToken-iPrev, 0, 1, &p1, &p2);
        sqlite3_free(aPoslist);
        aPoslist = pList;
        nPoslist = (int)(aOut - aPoslist);
        if( nPoslist==0 ){
          sqlite3_free(aPoslist);
          pPhrase->doclist.pList = 0;
          pPhrase->doclist.nList = 0;
          return SQLITE_OK;
        }
      }
      iPrev = iToken;
    }
  }

  if( iPrev>=0 ){
    int nMaxUndeferred = pPhrase->iDoclistToken;
    if( nMaxUndeferred<0 ){
      pPhrase->doclist.pList = aPoslist;
      pPhrase->doclist.nList = nPoslist;
      pPhrase->doclist.iDocid = pCsr->iPrevId;
      pPhrase->doclist.bFreeList = 1;
    }else{
      int nDistance;
      char *p1;
      char *p2;
      char *aOut;

      if( nMaxUndeferred>iPrev ){
        p1 = aPoslist;
        p2 = pPhrase->doclist.pList;
        nDistance = nMaxUndeferred - iPrev;
      }else{
        p1 = pPhrase->doclist.pList;
        p2 = aPoslist;
        nDistance = iPrev - nMaxUndeferred;
      }

      aOut = (char *)sqlite3_malloc(nPoslist+8);
      if( !aOut ){
        sqlite3_free(aPoslist);
        return SQLITE_NOMEM;
      }
      
      pPhrase->doclist.pList = aOut;
      if( fts3PoslistPhraseMerge(&aOut, nDistance, 0, 1, &p1, &p2) ){
        pPhrase->doclist.bFreeList = 1;
        pPhrase->doclist.nList = (int)(aOut - pPhrase->doclist.pList);
      }else{
        sqlite3_free(aOut);
        pPhrase->doclist.pList = 0;
        pPhrase->doclist.nList = 0;
      }
      sqlite3_free(aPoslist);
    }
  }

  return SQLITE_OK;
}